

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cin_fish.cpp
# Opt level: O0

int cin_fish(void)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  bool local_4d;
  int local_4c;
  double dStack_48;
  int j;
  double total;
  int i;
  double fish [5];
  
  std::operator<<((ostream *)&std::cout,"Please enter the weight of your fish:\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"You may enter up to ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
  std::operator<<(poVar2," fishes <q to terminate>.\n");
  std::operator<<((ostream *)&std::cout,"fish #1: ");
  total._4_4_ = 0;
  iVar1 = total._4_4_;
  while( true ) {
    total._4_4_ = iVar1;
    local_4d = false;
    if (total._4_4_ < 5) {
      plVar3 = (long *)std::istream::operator>>(&std::cin,fish + (long)total._4_4_ + -1);
      local_4d = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)))
      ;
    }
    if (local_4d == false) break;
    iVar1 = total._4_4_ + 1;
    if (iVar1 < 5) {
      poVar2 = std::operator<<((ostream *)&std::cout,"fish #");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,total._4_4_ + 2);
      std::operator<<(poVar2,": ");
    }
  }
  dStack_48 = 0.0;
  for (local_4c = 0; local_4c < total._4_4_; local_4c = local_4c + 1) {
    dStack_48 = fish[(long)local_4c + -1] + dStack_48;
  }
  if (total._4_4_ == 0) {
    std::operator<<((ostream *)&std::cout,"No fish...\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"The average(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,total._4_4_);
    poVar2 = std::operator<<(poVar2,"): ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_48 / (double)total._4_4_);
    std::operator<<(poVar2,".\n");
  }
  return 0;
}

Assistant:

int cin_fish () {
    using namespace std;

    double fish[MAX];

    cout << "Please enter the weight of your fish:\n";
    cout << "You may enter up to " << MAX << " fishes <q to terminate>.\n";
    cout << "fish #1: ";

    int i = 0;
    //  cin 读取返回 bool
    while ( i < MAX && cin >> fish[i]) {
        if (++i < MAX) {
            cout << "fish #" << i + 1 << ": ";
        }
    }

    // calculate average
    double total = 0;
    for (int j = 0; j < i; j++) {
        total += fish[j];
    }

    if (i == 0) {
        cout << "No fish...\n";
    } else {
        cout << "The average(" << i << "): " << total / i << ".\n";
    }

    return 0;
}